

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O1

_Bool build_pit(chunk *c,loc_conflict centre,wchar_t rating)

{
  monster_group_info group_info;
  monster_group_info group_info_00;
  monster_group_info group_info_01;
  monster_group_info group_info_02;
  monster_group_info group_info_03;
  monster_group_info group_info_04;
  monster_group_info group_info_05;
  monster_group_info group_info_06;
  monster_group_info group_info_07;
  monster_group_info group_info_08;
  monster_group_info group_info_09;
  monster_group_info group_info_10;
  monster_group_info group_info_11;
  monster_group_info group_info_12;
  monster_group_info group_info_13;
  monster_group_info group_info_14;
  monster_group_info group_info_15;
  monster_group_info group_info_16;
  monster_group_info group_info_17;
  monster_group_info group_info_18;
  monster_group_info group_info_19;
  monster_group_info group_info_20;
  chunk *pcVar1;
  monster_race *race;
  _Bool _Var2;
  wchar_t y2;
  int iVar3;
  wchar_t wVar4;
  uint32_t uVar5;
  monster_race *pmVar6;
  loc lVar7;
  loc_conflict grid;
  wchar_t i2;
  wchar_t wVar8;
  int iVar9;
  long lVar10;
  wchar_t y1;
  int y;
  int y_00;
  bool bVar11;
  wchar_t y2_00;
  wchar_t wVar12;
  int iVar13;
  wchar_t wVar14;
  ulong uVar15;
  wchar_t wVar16;
  monster_group_info info;
  monster_race *what [16];
  loc local_110;
  wchar_t local_104;
  ulong local_100;
  monster_race *local_f8;
  chunk *local_f0;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  monster_race *local_d0;
  monster_race *local_c8;
  monster_race *local_c0 [18];
  
  local_110 = (loc)centre;
  event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,L'\v',L'\x11');
  if (((local_110.y < c->height) && (local_110.x < c->width)) ||
     (_Var2 = find_space((loc_conflict *)&local_110,L'\v',L'\x11'), _Var2)) {
    wVar16 = local_110.x;
    wVar12 = local_110.y;
    uVar15 = (ulong)(uint)local_110.y;
    local_f0 = (chunk *)CONCAT44(local_f0._4_4_,local_110.y + L'\xfffffffc');
    y2 = local_110.y + L'\x04';
    local_104 = local_110.x + L'\xfffffff9';
    wVar14 = local_110.x + L'\a';
    y1 = local_110.y + L'\xfffffffb';
    wVar8 = local_110.x + L'\xfffffff8';
    y2_00 = local_110.y + L'\x05';
    wVar4 = local_110.x + L'\b';
    lVar10 = 0;
    generate_room(c,y1,wVar8,y2_00,wVar4,L'\0');
    draw_rectangle(c,y1,wVar8,y2_00,wVar4,FEAT_GRANITE,L'\f',false);
    fill_rectangle(c,(wchar_t)local_f0,local_104,y2,wVar14,FEAT_FLOOR,L'\0');
    wVar8 = wVar12 + L'\xfffffffd';
    wVar14 = wVar16 + L'\xfffffffa';
    wVar12 = wVar12 + L'\x03';
    wVar16 = wVar16 + L'\x06';
    local_100 = uVar15;
    draw_rectangle(c,wVar8,wVar14,wVar12,wVar16,FEAT_GRANITE,L'\v',false);
    generate_hole(c,wVar8,wVar14,wVar12,wVar16,FEAT_CLOSED);
    set_pit_type(c->depth,L'\x01');
    event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,dun->pit_type->name);
    wVar14 = dun->pit_type->obj_rarity;
    get_mon_num_prep(mon_pit_hook);
    bVar11 = false;
    do {
      pmVar6 = get_mon_num(c->depth + L'\n',c->depth);
      local_c0[lVar10 + 1] = pmVar6;
      if (pmVar6 == (monster_race *)0x0) {
        bVar11 = true;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x10);
    _Var2 = false;
    local_f0 = c;
    get_mon_num_prep((_func__Bool_monster_race_ptr *)0x0);
    if (!bVar11) {
      if ((player->opts).opt[0x18] == true) {
        msg("Monster pit (%s)",dun->pit_type->name);
      }
      pcVar1 = local_f0;
      iVar3 = 0;
      do {
        lVar10 = 1;
        do {
          pmVar6 = local_c0[lVar10];
          if (local_c0[lVar10 + 1]->level < pmVar6->level) {
            local_c0[lVar10] = local_c0[lVar10 + 1];
            local_c0[lVar10 + 1] = pmVar6;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x10);
        iVar3 = iVar3 + 1;
      } while (iVar3 != 0xf);
      lVar10 = 0;
      do {
        *(undefined8 *)((long)local_c0 + lVar10 + 8) =
             *(undefined8 *)((long)local_c0 + lVar10 * 2 + 8);
        lVar10 = lVar10 + 8;
      } while (lVar10 != 0x40);
      add_to_monster_rating(local_f0,dun->pit_type->ave / 0x14 + 3);
      wVar4 = monster_group_index_new((chunk_conflict *)pcVar1);
      place_new_monster(pcVar1,local_110,local_c0[8],false,false,
                        (monster_group_info)ZEXT416((uint)wVar4),'\f');
      pmVar6 = local_c0[1];
      wVar8 = local_110.x;
      local_d4 = local_110.x + L'\xfffffffd';
      iVar3 = local_110.x + L'\x03';
      iVar13 = (int)local_100 + -2;
      y = (int)local_100 + 2;
      iVar9 = local_110.x + L'\xfffffffc';
      do {
        iVar9 = iVar9 + 1;
        lVar7 = (loc)loc(iVar9,iVar13);
        group_info.role = 1;
        group_info.index = wVar4;
        group_info.player_race = (player_race *)0x0;
        place_new_monster(pcVar1,lVar7,pmVar6,false,false,group_info,'\f');
        lVar7 = (loc)loc(iVar9,y);
        group_info_00.role = 1;
        group_info_00.index = wVar4;
        group_info_00.player_race = (player_race *)0x0;
        place_new_monster(pcVar1,lVar7,pmVar6,false,false,group_info_00,'\f');
        race = local_c0[2];
      } while (iVar9 < iVar3);
      local_d8 = wVar8 + L'\xfffffffb';
      iVar9 = wVar8 + L'\xfffffffa';
      do {
        iVar9 = iVar9 + 1;
        lVar7 = (loc)loc(iVar9,iVar13);
        group_info_01.role = 1;
        group_info_01.index = wVar4;
        group_info_01.player_race = (player_race *)0x0;
        place_new_monster(pcVar1,lVar7,race,false,false,group_info_01,'\f');
        lVar7 = (loc)loc(iVar9,y);
        group_info_02.role = 1;
        group_info_02.index = wVar4;
        group_info_02.player_race = (player_race *)0x0;
        place_new_monster(pcVar1,lVar7,race,false,false,group_info_02,'\f');
        pmVar6 = local_c0[2];
      } while (iVar9 < wVar8 + L'\xfffffffc');
      local_dc = wVar8 + L'\x04';
      local_f8 = (monster_race *)CONCAT44(local_f8._4_4_,wVar8 + L'\x05');
      iVar9 = iVar3;
      do {
        iVar9 = iVar9 + 1;
        lVar7 = (loc)loc(iVar9,iVar13);
        group_info_03.role = 1;
        group_info_03.index = wVar4;
        group_info_03.player_race = (player_race *)0x0;
        place_new_monster(pcVar1,lVar7,pmVar6,false,false,group_info_03,'\f');
        lVar7 = (loc)loc(iVar9,y);
        group_info_04.role = 1;
        group_info_04.index = wVar4;
        group_info_04.player_race = (player_race *)0x0;
        place_new_monster(pcVar1,lVar7,pmVar6,false,false,group_info_04,'\f');
      } while (iVar9 < (int)local_f8);
      local_e4 = (int)local_100 + -1;
      local_c0[0] = local_c0[1];
      local_c8 = local_c0[2];
      local_d0 = local_c0[3];
      wVar16 = wVar8 + L'\xfffffffe';
      local_e0 = wVar8 + L'\x02';
      do {
        iVar13 = iVar13 + 1;
        lVar7 = (loc)loc(local_d8,iVar13);
        pmVar6 = local_c0[0];
        group_info_05.role = 1;
        group_info_05.index = wVar4;
        group_info_05.player_race = (player_race *)0x0;
        place_new_monster(pcVar1,lVar7,local_c0[0],false,false,group_info_05,'\f');
        lVar7 = (loc)loc((int)local_f8,iVar13);
        group_info_06.role = 1;
        group_info_06.index = wVar4;
        group_info_06.player_race = (player_race *)0x0;
        place_new_monster(pcVar1,lVar7,pmVar6,false,false,group_info_06,'\f');
        lVar7 = (loc)loc(wVar8 + L'\xfffffffc',iVar13);
        pmVar6 = local_c8;
        group_info_07.role = 1;
        group_info_07.index = wVar4;
        group_info_07.player_race = (player_race *)0x0;
        place_new_monster(pcVar1,lVar7,local_c8,false,false,group_info_07,'\f');
        lVar7 = (loc)loc(local_dc,iVar13);
        group_info_08.role = 1;
        group_info_08.index = wVar4;
        group_info_08.player_race = (player_race *)0x0;
        place_new_monster(pcVar1,lVar7,pmVar6,false,false,group_info_08,'\f');
        lVar7 = (loc)loc(local_d4,iVar13);
        pmVar6 = local_d0;
        group_info_09.role = 1;
        group_info_09.index = wVar4;
        group_info_09.player_race = (player_race *)0x0;
        place_new_monster(pcVar1,lVar7,local_d0,false,false,group_info_09,'\f');
        lVar7 = (loc)loc(iVar3,iVar13);
        group_info_10.role = 1;
        group_info_10.index = wVar4;
        group_info_10.player_race = (player_race *)0x0;
        place_new_monster(pcVar1,lVar7,pmVar6,false,false,group_info_10,'\f');
        lVar7 = (loc)loc(wVar16,iVar13);
        group_info_11.role = 1;
        group_info_11.index = wVar4;
        group_info_11.player_race = (player_race *)0x0;
        place_new_monster(pcVar1,lVar7,local_c0[4],false,false,group_info_11,'\f');
        lVar7 = (loc)loc(local_e0,iVar13);
        group_info_12.role = 1;
        group_info_12.index = wVar4;
        group_info_12.player_race = (player_race *)0x0;
        place_new_monster(pcVar1,lVar7,local_c0[4],false,false,group_info_12,'\f');
        iVar9 = local_e4;
      } while (iVar13 <= (int)local_100);
      y_00 = (int)local_100 + 1;
      iVar3 = wVar8 + L'\xffffffff';
      lVar7 = (loc)loc(iVar3,local_e4);
      local_f8 = local_c0[5];
      group_info_13.role = 1;
      group_info_13.index = wVar4;
      group_info_13.player_race = (player_race *)0x0;
      place_new_monster(pcVar1,lVar7,local_c0[5],false,false,group_info_13,'\f');
      iVar13 = wVar8 + L'\x01';
      lVar7 = (loc)loc(iVar13,iVar9);
      pmVar6 = local_f8;
      group_info_14.role = 1;
      group_info_14.index = wVar4;
      group_info_14.player_race = (player_race *)0x0;
      place_new_monster(pcVar1,lVar7,local_f8,false,false,group_info_14,'\f');
      lVar7 = (loc)loc(iVar3,y_00);
      group_info_15.role = 1;
      group_info_15.index = wVar4;
      group_info_15.player_race = (player_race *)0x0;
      place_new_monster(pcVar1,lVar7,pmVar6,false,false,group_info_15,'\f');
      lVar7 = (loc)loc(iVar13,y_00);
      group_info_16.role = 1;
      group_info_16.index = wVar4;
      group_info_16.player_race = (player_race *)0x0;
      place_new_monster(pcVar1,lVar7,pmVar6,false,false,group_info_16,'\f');
      do {
        wVar16 = wVar16 + L'\x01';
        lVar7 = (loc)loc(wVar16,y_00);
        group_info_17.role = 1;
        group_info_17.index = wVar4;
        group_info_17.player_race = (player_race *)0x0;
        place_new_monster(pcVar1,lVar7,local_c0[6],false,false,group_info_17,'\f');
        lVar7 = (loc)loc(wVar16,iVar9);
        group_info_18.role = 1;
        group_info_18.index = wVar4;
        group_info_18.player_race = (player_race *)0x0;
        place_new_monster(pcVar1,lVar7,local_c0[6],false,false,group_info_18,'\f');
      } while (wVar16 <= wVar8);
      iVar9 = (int)local_100;
      lVar7 = (loc)loc(iVar13,iVar9);
      group_info_19.role = 1;
      group_info_19.index = wVar4;
      group_info_19.player_race = (player_race *)0x0;
      place_new_monster(pcVar1,lVar7,local_c0[7],false,false,group_info_19,'\f');
      lVar7 = (loc)loc(iVar3,iVar9);
      group_info_20.role = 1;
      group_info_20.index = wVar4;
      group_info_20.player_race = (player_race *)0x0;
      place_new_monster(pcVar1,lVar7,local_c0[7],false,false,group_info_20,'\f');
      local_104 = wVar14;
      iVar3 = wVar8 + L'\xfffffff6';
      iVar9 = iVar9 + -2;
      do {
        iVar3 = iVar3 + 1;
        wVar4 = Rand_div(100);
        if (wVar4 < wVar14) {
          grid = loc(iVar3,iVar9);
          pcVar1 = local_f0;
          wVar4 = local_f0->depth;
          uVar5 = Rand_div(3);
          wVar14 = local_104;
          place_object((chunk_conflict *)pcVar1,grid,wVar4 + L'\n',uVar5 == 0,false,'\x04',L'\0');
        }
      } while ((iVar3 < wVar8 + L'\t') ||
              (bVar11 = iVar9 < y, iVar3 = wVar8 + L'\xfffffff6', iVar9 = iVar9 + 1, bVar11));
      _Var2 = true;
    }
  }
  else {
    _Var2 = false;
  }
  return _Var2;
}

Assistant:

bool build_pit(struct chunk *c, struct loc centre, int rating)
{
	struct monster_race *what[16];
	int i, j, y, x, y1, x1, y2, x2;
	bool empty = false;
	int light = false;
	int alloc_obj;
	int height = 9;
	int width = 15;
	int group_index = 0;
	struct monster_group_info info = { 0, 0, 0 };

	/* Find and reserve some space in the dungeon.  Get center of room. */
	event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE, height + 2, width + 2);
	if ((centre.y >= c->height) || (centre.x >= c->width)) {
		if (!find_space(&centre, height + 2, width + 2))
			return (false);
	}

	/* Large room */
	y1 = centre.y - height / 2;
	y2 = centre.y + height / 2;
	x1 = centre.x - width / 2;
	x2 = centre.x + width / 2;

	/* Generate new room, outer walls and inner floor */
	generate_room(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, light);
	draw_rectangle(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, FEAT_GRANITE,
		SQUARE_WALL_OUTER, false);
	fill_rectangle(c, y1, x1, y2, x2, FEAT_FLOOR, SQUARE_NONE);

	/* Advance to the center room */
	y1 = y1 + 2;
	y2 = y2 - 2;
	x1 = x1 + 2;
	x2 = x2 - 2;

	/* Generate inner walls; add one door as entrance */
	draw_rectangle(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, FEAT_GRANITE,
		SQUARE_WALL_INNER, false);
	generate_hole(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, FEAT_CLOSED);

	/* Decide on the pit type */
	set_pit_type(c->depth, 1);
	event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE, dun->pit_type->name);

	/* Chance of objects on the floor */
	alloc_obj = dun->pit_type->obj_rarity;
	
	/* Prepare allocation table */
	get_mon_num_prep(mon_pit_hook);

	/* Pick some monster types */
	for (i = 0; i < 16; i++) {
		/* Get a (hard) monster type */
		what[i] = get_mon_num(c->depth + 10, c->depth);

		/* Notice failure */
		if (!what[i]) empty = true;
	}

	/* Prepare allocation table */
	get_mon_num_prep(NULL);

	/* Oops */
	if (empty)
		return false;

	ROOM_LOG("Monster pit (%s)", dun->pit_type->name);

	/* Sort the entries XXX XXX XXX */
	for (i = 0; i < 16 - 1; i++) {
		/* Sort the entries */
		for (j = 0; j < 16 - 1; j++) {
			int i1 = j;
			int i2 = j + 1;

			int p1 = what[i1]->level;
			int p2 = what[i2]->level;

			/* Bubble */
			if (p1 > p2) {
				struct monster_race *tmp = what[i1];
				what[i1] = what[i2];
				what[i2] = tmp;
			}
		}
	}

	/* Select every other entry */
	for (i = 0; i < 8; i++)
		what[i] = what[i * 2];

	/* Increase the level rating */
	add_to_monster_rating(c, 3 + dun->pit_type->ave / 20);

	/* Get a group ID */
	group_index = monster_group_index_new(c);

	/* Center monster */
	info.index = group_index;
	info.role = MON_GROUP_LEADER;
	place_new_monster(c, centre, what[7], false, false, info, ORIGIN_DROP_PIT);

	/* Remaining monsters are servants */
	info.role = MON_GROUP_SERVANT;

	/* Top and bottom rows (middle) */
	for (x = centre.x - 3; x <= centre.x + 3; x++) {
		place_new_monster(c, loc(x, centre.y - 2), what[0], false, false, info,
						  ORIGIN_DROP_PIT);
		place_new_monster(c, loc(x, centre.y + 2), what[0], false, false, info,
						  ORIGIN_DROP_PIT);
	}
    
	/* Corners */
	for (x = centre.x - 5; x <= centre.x - 4; x++) {
		place_new_monster(c, loc(x, centre.y - 2), what[1], false, false, info,
						  ORIGIN_DROP_PIT);
		place_new_monster(c, loc(x, centre.y + 2), what[1], false, false, info,
						  ORIGIN_DROP_PIT);
	}
    
	for (x = centre.x + 4; x <= centre.x + 5; x++) {
		place_new_monster(c, loc(x, centre.y - 2), what[1], false, false, info,
						  ORIGIN_DROP_PIT);
		place_new_monster(c, loc(x, centre.y + 2), what[1], false, false, info,
						  ORIGIN_DROP_PIT);
	}
    
	/* Corners */

	/* Middle columns */
	for (y = centre.y - 1; y <= centre.y + 1; y++) {
		place_new_monster(c, loc(centre.x - 5, y), what[0], false, false, info,
						  ORIGIN_DROP_PIT);
		place_new_monster(c, loc(centre.x + 5, y), what[0], false, false, info,
						  ORIGIN_DROP_PIT);

		place_new_monster(c, loc(centre.x - 4, y), what[1], false, false, info,
						  ORIGIN_DROP_PIT);
		place_new_monster(c, loc(centre.x + 4, y), what[1], false, false, info,
						  ORIGIN_DROP_PIT);

		place_new_monster(c, loc(centre.x - 3, y), what[2], false, false, info,
						  ORIGIN_DROP_PIT);
		place_new_monster(c, loc(centre.x + 3, y), what[2], false, false, info,
						  ORIGIN_DROP_PIT);

		place_new_monster(c, loc(centre.x - 2, y), what[3], false, false, info,
						  ORIGIN_DROP_PIT);
		place_new_monster(c, loc(centre.x + 2, y), what[3], false, false, info,
						  ORIGIN_DROP_PIT);
	}
    
	/* Corners around the middle monster */
	place_new_monster(c, loc(centre.x - 1, centre.y - 1), what[4], false, false,
					  info, ORIGIN_DROP_PIT);
	place_new_monster(c, loc(centre.x + 1, centre.y - 1), what[4], false, false,
					  info, ORIGIN_DROP_PIT);
	place_new_monster(c, loc(centre.x - 1, centre.y + 1), what[4], false, false,
					  info, ORIGIN_DROP_PIT);
	place_new_monster(c, loc(centre.x + 1, centre.y + 1), what[4], false, false,
					  info, ORIGIN_DROP_PIT);

	/* Above/Below the center monster */
	for (x = centre.x - 1; x <= centre.x + 1; x++) {
		place_new_monster(c, loc(x, centre.y + 1), what[5], false, false, info,
						  ORIGIN_DROP_PIT);
		place_new_monster(c, loc(x, centre.y - 1), what[5], false, false, info,
						  ORIGIN_DROP_PIT);
	}

	/* Next to the center monster */
	place_new_monster(c, loc(centre.x + 1, centre.y), what[6], false, false,
					  info, ORIGIN_DROP_PIT);
	place_new_monster(c, loc(centre.x - 1, centre.y), what[6], false, false,
					  info, ORIGIN_DROP_PIT);

	/* Place some objects */
	for (y = centre.y - 2; y <= centre.y + 2; y++) {
		for (x = centre.x - 9; x <= centre.x + 9; x++) {
			/* Occasionally place an item, making it good 1/3 of the time */
			if (randint0(100) < alloc_obj) 
				place_object(c, loc(x, y), c->depth + 10, one_in_(3), false,
							 ORIGIN_PIT, 0);
		}
	}

	return true;
}